

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O0

void __thiscall OpenMD::Morse::initialize(Morse *this)

{
  bool bVar1;
  undefined8 uVar2;
  AtomType *pAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RDI;
  MorseType variant;
  RealType beta;
  RealType Re;
  RealType De;
  MorseInteractionType *mit;
  AtomType *at2;
  AtomType *at1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  ForceField *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  MorseType in_stack_fffffffffffffe24;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffe28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe30;
  MapTypeIterator *in_stack_fffffffffffffe38;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  errorStruct *peVar6;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  MorseInteractionType *in_stack_fffffffffffffe58;
  ForceField *in_stack_fffffffffffffe60;
  MorseType mt;
  RealType in_stack_fffffffffffffea8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  RealType in_stack_fffffffffffffeb8;
  AtomType *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  errorStruct *in_stack_fffffffffffffed0;
  undefined1 local_c0 [64];
  MorseInteractionType *local_80;
  AtomType *local_78;
  AtomType *local_70;
  ForceField *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  local_20;
  NonBondedInteractionTypeContainer *local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a9a48);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3a9a61);
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
           *)0x3a9a72);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  ForceField::getNAtomType((ForceField *)0x3a9a8a);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,&in_stack_fffffffffffffe40->index_)
  ;
  local_18 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x78));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator(&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3a9ae8);
  local_40 = (ForceField *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  while (local_40 != (ForceField *)0x0) {
    bVar1 = NonBondedInteractionType::isMorse((NonBondedInteractionType *)local_40);
    if (bVar1) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffe28,
                 (MapTypeIterator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffe30,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffe30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,0);
      local_70 = ForceField::getAtomType
                           (in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
      if (local_70 == (AtomType *)0x0) {
        in_stack_fffffffffffffecc = 0;
        in_stack_fffffffffffffea8 = 0.0;
        in_stack_fffffffffffffeb0 = &local_38;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffeb0,0);
        in_stack_fffffffffffffeb8 = (RealType)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        in_stack_fffffffffffffec0 = (AtomType *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffeb0,1);
        uVar2 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffed0 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,uVar2);
        in_stack_fffffffffffffed0->severity = 1;
        in_stack_fffffffffffffed0->isFatal = 1;
        simError();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,1);
      pAVar3 = ForceField::getAtomType
                         (in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
      local_78 = pAVar3;
      if (pAVar3 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar2 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,uVar2,uVar4,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      mt = (MorseType)((ulong)pAVar3 >> 0x20);
      in_stack_fffffffffffffe60 = local_40;
      if (local_40 == (ForceField *)0x0) {
        in_stack_fffffffffffffe58 = (MorseInteractionType *)0x0;
      }
      else {
        in_stack_fffffffffffffe58 =
             (MorseInteractionType *)
             __dynamic_cast(local_40,&NonBondedInteractionType::typeinfo,
                            &MorseInteractionType::typeinfo,0);
      }
      local_80 = in_stack_fffffffffffffe58;
      if (in_stack_fffffffffffffe58 == (MorseInteractionType *)0x0) {
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffe18);
        uVar2 = std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffe18);
        in_stack_fffffffffffffe40 = (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)local_c0;
        uVar4 = std::__cxx11::string::c_str();
        peVar6 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not convert NonBondedInteractionType\n\tto MorseInteractionType for %s - %s interaction.\n"
                 ,uVar2,uVar4);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffe40);
        std::__cxx11::string::~string((string *)(local_c0 + 0x20));
        peVar6->severity = 1;
        peVar6->isFatal = 1;
        simError();
      }
      in_stack_fffffffffffffe38 = (MapTypeIterator *)MorseInteractionType::getD(local_80);
      in_stack_fffffffffffffe30 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)MorseInteractionType::getR(local_80);
      in_stack_fffffffffffffe28 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           MorseInteractionType::getBeta(local_80);
      in_stack_fffffffffffffe24 = MorseInteractionType::getInteractionType(local_80);
      addExplicitInteraction
                ((Morse *)in_stack_fffffffffffffed0,
                 (AtomType *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (RealType)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,mt);
    }
    in_stack_fffffffffffffe18 =
         (ForceField *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_40 = in_stack_fffffffffffffe18;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void Morse::initialize() {
    Mtypes.clear();
    Mtids.clear();
    MixingMap.clear();
    nM_ = 0;

    Mtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMorse()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Morse::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Morse::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        MorseInteractionType* mit = dynamic_cast<MorseInteractionType*>(nbt);

        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Morse::initialize could not convert NonBondedInteractionType\n"
              "\tto MorseInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType De   = mit->getD();
        RealType Re   = mit->getR();
        RealType beta = mit->getBeta();

        MorseType variant = mit->getInteractionType();
        addExplicitInteraction(at1, at2, De, Re, beta, variant);
      }
    }
    initialized_ = true;
  }